

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

bool __thiscall
Clasp::Asp::LogicProgram::extractCore(LogicProgram *this,LitVec *solverCore,LitVec *prgLits)

{
  pointer pVVar1;
  SharedContext *pSVar2;
  Literal LVar3;
  PrgAtom *this_00;
  pointer pLVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  Id_t *x;
  ulong uVar9;
  int local_4c;
  long local_48;
  pointer local_40;
  LitVec *local_38;
  
  (prgLits->ebo_).size = 0;
  pLVar4 = (solverCore->ebo_).buf;
  uVar7 = (solverCore->ebo_).size;
  uVar9 = (ulong)uVar7;
  pSVar2 = (this->super_ProgramBuilder).ctx_;
  lVar8 = uVar9 * 4;
  lVar5 = 0;
  do {
    if (lVar8 == 0) {
LAB_0013ab9b:
      local_40 = (this->frozen_).ebo_.buf;
      lVar8 = (ulong)(this->frozen_).ebo_.size << 2;
      lVar5 = 0;
      local_48 = lVar8;
      local_38 = solverCore;
      while ((lVar8 != lVar5 && ((int)uVar9 != 0))) {
        this_00 = getRootAtom(this,*(Id_t *)((long)local_40 + lVar5));
        LVar3 = PrgHead::assumption(&this_00->super_PrgHead);
        if ((1 < LVar3.rep_) &&
           (lVar8 = local_48,
           (2U - ((LVar3.rep_ & 2) == 0) &
           (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[LVar3.rep_ >> 2].rep) != 0)) {
          local_4c = -*(int *)((long)local_40 + lVar5);
          if ((*(int *)&(this_00->super_PrgHead).super_PrgNode * 2 ^ LVar3.rep_) < 2) {
            local_4c = *(int *)((long)local_40 + lVar5);
          }
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,&local_4c);
          pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (LVar3.rep_ >> 2);
          pVVar1->rep = pVVar1->rep & ((LVar3.rep_ & 2) == 0) - 3U;
          uVar9 = (ulong)((int)uVar9 - 1);
          lVar8 = local_48;
        }
        lVar5 = lVar5 + 4;
      }
      x = (Id_t *)(this->assume_).ebo_.buf;
      lVar8 = (ulong)(this->assume_).ebo_.size << 2;
      while ((lVar8 != 0 && ((int)uVar9 != 0))) {
        LVar3 = getLiteral(this,*x,(MapLit_t)0x0);
        if ((2U - ((LVar3.rep_ & 2) == 0) &
            (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[LVar3.rep_ >> 2].rep) != 0) {
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,(int *)x);
          pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (LVar3.rep_ >> 2);
          pVVar1->rep = pVVar1->rep & ((LVar3.rep_ & 2) == 0) - 3U;
          uVar9 = (ulong)((int)uVar9 - 1);
        }
        x = x + 1;
        lVar8 = lVar8 + -4;
      }
      pLVar4 = (local_38->ebo_).buf;
      uVar9 = (ulong)(local_38->ebo_).size;
LAB_0013ad0c:
      pSVar2 = (this->super_ProgramBuilder).ctx_;
      for (lVar8 = 0; uVar9 * 4 != lVar8; lVar8 = lVar8 + 4) {
        uVar7 = *(uint *)((long)&pLVar4->rep_ + lVar8) >> 2;
        if (uVar7 < (pSVar2->varInfo_).ebo_.size) {
          pVVar1 = (pSVar2->varInfo_).ebo_.buf + uVar7;
          pVVar1->rep = pVVar1->rep & 0xfc;
        }
      }
      return (prgLits->ebo_).size == (size_type)uVar9;
    }
    uVar6 = pLVar4[lVar5].rep_ >> 2;
    if ((pSVar2->varInfo_).ebo_.size <= uVar6) {
      if (uVar7 != (uint)lVar5) goto LAB_0013ad0c;
      goto LAB_0013ab9b;
    }
    pVVar1 = (pSVar2->varInfo_).ebo_.buf + uVar6;
    pVVar1->rep = pVVar1->rep | 2U - ((pLVar4[lVar5].rep_ & 2) == 0);
    lVar5 = lVar5 + 1;
    lVar8 = lVar8 + -4;
  } while( true );
}

Assistant:

bool LogicProgram::extractCore(const LitVec& solverCore, Potassco::LitVec& prgLits) const 	{
	uint32 marked = 0;
	prgLits.clear();
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (!ctx()->validVar(it->var())) { break; }
		ctx()->mark(*it);
		++marked;
	}
	if (marked == solverCore.size()) {
		for (VarVec::const_iterator it = frozen_.begin(), end = frozen_.end(); it != end && marked; ++it) {
			PrgAtom* atom = getRootAtom(*it);
			Literal lit = atom->assumption();
			if (lit == lit_true() || !ctx()->marked(lit)) continue;
			prgLits.push_back(atom->literal() == lit ? Potassco::lit(*it) : Potassco::neg(*it));
			ctx()->unmark(lit);
			--marked;
		}
		for (Potassco::LitVec::const_iterator it = assume_.begin(), end = assume_.end(); it != end && marked; ++it) {
			Literal lit = getLiteral(Potassco::id(*it));
			if (!ctx()->marked(lit)) continue;
			prgLits.push_back(*it);
			ctx()->unmark(lit);
			--marked;
		}
	}
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (ctx()->validVar(it->var()))
			ctx()->unmark(it->var());
	}
	return prgLits.size() == solverCore.size();
}